

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

uint32_t VP8LPredictor13_C(uint32_t *left,uint32_t *top)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = top[-1];
  uVar6 = (*top & *left) + ((*top ^ *left) >> 1 & 0x7f7f7f7f);
  uVar1 = (uVar6 >> 0x18) - (uVar3 >> 0x18);
  uVar2 = (int)(short)((int)((uint)(ushort)((short)uVar1 >> 0xf) << 0x10 | uVar1 & 0xffff) / 2) +
          (uVar6 >> 0x18);
  uVar1 = ~uVar2 >> 0x18;
  if (uVar2 < 0x100) {
    uVar1 = uVar2;
  }
  uVar4 = uVar6 >> 0x10 & 0xff;
  uVar2 = uVar4 - (uVar3 >> 0x10 & 0xff);
  uVar4 = (int)(short)((int)((uint)(ushort)((short)uVar2 >> 0xf) << 0x10 | uVar2 & 0xffff) / 2) +
          uVar4;
  uVar2 = ~uVar4 >> 0x18;
  if (uVar4 < 0x100) {
    uVar2 = uVar4;
  }
  uVar5 = uVar6 >> 8 & 0xff;
  uVar4 = uVar5 - (uVar3 >> 8 & 0xff);
  uVar5 = (int)(short)((int)((uint)(ushort)((short)uVar4 >> 0xf) << 0x10 | uVar4 & 0xffff) / 2) +
          uVar5;
  uVar4 = ~uVar5 >> 0x18;
  if (uVar5 < 0x100) {
    uVar4 = uVar5;
  }
  uVar3 = (uVar6 & 0xff) - (uVar3 & 0xff);
  uVar6 = (int)(short)((int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) / 2) +
          (uVar6 & 0xff);
  uVar3 = ~uVar6 >> 0x18;
  if (uVar6 < 0x100) {
    uVar3 = uVar6;
  }
  return uVar4 * 0x100 + uVar2 * 0x10000 + uVar1 * 0x1000000 + uVar3;
}

Assistant:

uint32_t VP8LPredictor13_C(const uint32_t* const left,
                           const uint32_t* const top) {
  const uint32_t pred = ClampedAddSubtractHalf(*left, top[0], top[-1]);
  return pred;
}